

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadExtend
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  Literal *pLVar5;
  Literal *this_00;
  array<wasm::Literal,_8UL> local_358;
  array<wasm::Literal,_4UL> local_298;
  undefined1 auStack_238 [8];
  array<wasm::Literal,_2UL> lanes;
  SIMDLoad *local_170;
  Address memorySize;
  Type addressType;
  Literal local_148;
  undefined1 local_130 [8];
  MemoryInstanceInfo info;
  Literal local_100;
  Literal local_e8;
  Type local_d0;
  anon_class_16_2_3ef7c955 loadLane;
  anon_class_48_6_a8494b4f fillLanes;
  Flow flow;
  Address src;
  SIMDLoad *curr_local;
  
  src.addr = (address64_t)curr;
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&fillLanes.memorySize,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             curr->ptr);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)fillLanes.memorySize != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    flow.breakTo.super_IString.str._M_str = (char *)::wasm::Literal::getUnsigned();
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_130,this,(Name)((IString *)(src.addr + 0x30))->str);
    local_d0.id = (uintptr_t)&src;
    loadLane.curr = (SIMDLoad **)local_130;
    local_170 = (SIMDLoad *)
                getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_130,(Name)info._0_16_);
    fillLanes.curr = &local_170;
    memorySize.addr = *(address64_t *)(*(long *)(src.addr + 0x28) + 8);
    fillLanes.src = &memorySize;
    loadLane.info = (MemoryInstanceInfo *)&flow.breakTo.super_IString.str._M_str;
    fillLanes.addressType = &local_d0;
    uVar1 = *(uint *)(src.addr + 0x10);
    fillLanes.loadLane = (anon_class_16_2_3ef7c955 *)local_130;
    fillLanes.info = (MemoryInstanceInfo *)&src;
    if (9 < uVar1) {
LAB_001c9b9d:
      ::wasm::handle_unreachable
                ("unexpected op",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0xf33);
    }
    if ((0x30U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x300U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_001c9b9d;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_238 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        bVar3 = false;
        pLVar5 = (Literal *)auStack_238;
        this_00 = (Literal *)&addressType;
        do {
          ::wasm::Literal::Literal(this_00,pLVar5);
          bVar2 = !bVar3;
          bVar3 = true;
          pLVar5 = (Literal *)&lanes._M_elems[0].type;
          this_00 = &local_148;
        } while (bVar2);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_e8,&loadLane.info,(array<wasm::Literal,_2UL> *)&addressType,4);
        Flow::Flow(__return_storage_ptr__,&local_e8);
        ::wasm::Literal::~Literal(&local_e8);
        lVar4 = 0x18;
        do {
          ::wasm::Literal::~Literal((Literal *)((long)&addressType.id + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        lVar4 = 0x18;
        do {
          ::wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar4 + -8));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
      else {
        lanes._M_elems[1].type.id = 0;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_238 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        lVar4 = 0;
        do {
          ::wasm::Literal::Literal
                    ((Literal *)((long)&local_298._M_elems[0].field_0 + lVar4),
                     (Literal *)((long)lanes._M_elems + lVar4 + -8));
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x60);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_100,&loadLane.info,&local_298,2);
        Flow::Flow(__return_storage_ptr__,&local_100);
        ::wasm::Literal::~Literal(&local_100);
        lVar4 = 0x48;
        do {
          ::wasm::Literal::~Literal((Literal *)((long)&local_298._M_elems[0].field_0 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        lVar4 = 0x48;
        do {
          ::wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar4 + -8));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
    }
    else {
      lVar4 = 0;
      memset(auStack_238,0,0xc0);
      do {
        ::wasm::Literal::Literal
                  ((Literal *)((long)&local_358._M_elems[0].field_0 + lVar4),
                   (Literal *)((long)lanes._M_elems + lVar4 + -8));
        lVar4 = lVar4 + 0x18;
      } while (lVar4 != 0xc0);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                ((Literal *)&info.name.super_IString.str._M_str,&loadLane.info,&local_358,1);
      Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
      lVar4 = 0xa8;
      do {
        ::wasm::Literal::~Literal((Literal *)((long)&local_358._M_elems[0].field_0 + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      lVar4 = 0xa8;
      do {
        ::wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar4 + -8));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
    }
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)fillLanes.memorySize;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadExtend(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    Address src(flow.getSingleValue().getUnsigned());
    auto info = getMemoryInstanceInfo(curr->memory);
    auto loadLane = [&](Address addr) {
      switch (curr->op) {
        case Load8x8SVec128:
          return Literal(int32_t(info.interface()->load8s(addr, info.name)));
        case Load8x8UVec128:
          return Literal(int32_t(info.interface()->load8u(addr, info.name)));
        case Load16x4SVec128:
          return Literal(int32_t(info.interface()->load16s(addr, info.name)));
        case Load16x4UVec128:
          return Literal(int32_t(info.interface()->load16u(addr, info.name)));
        case Load32x2SVec128:
          return Literal(int64_t(info.interface()->load32s(addr, info.name)));
        case Load32x2UVec128:
          return Literal(int64_t(info.interface()->load32u(addr, info.name)));
        default:
          WASM_UNREACHABLE("unexpected op");
      }
      WASM_UNREACHABLE("invalid op");
    };
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addressType = curr->ptr->type;
    auto fillLanes = [&](auto lanes, size_t laneBytes) {
      for (auto& lane : lanes) {
        auto ptr = Literal::makeFromInt64(src, addressType);
        lane = loadLane(
          info.instance->getFinalAddress(curr, ptr, laneBytes, memorySize));
        src =
          ptr.add(Literal::makeFromInt32(laneBytes, addressType)).getUnsigned();
      }
      return Literal(lanes);
    };
    switch (curr->op) {
      case Load8x8SVec128:
      case Load8x8UVec128: {
        std::array<Literal, 8> lanes;
        return fillLanes(lanes, 1);
      }
      case Load16x4SVec128:
      case Load16x4UVec128: {
        std::array<Literal, 4> lanes;
        return fillLanes(lanes, 2);
      }
      case Load32x2SVec128:
      case Load32x2UVec128: {
        std::array<Literal, 2> lanes;
        return fillLanes(lanes, 4);
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    WASM_UNREACHABLE("invalid op");
  }